

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O1

void mcode_allocarea(jit_State *J)

{
  MCode *pMVar1;
  bool bVar2;
  uint uVar3;
  long *__addr;
  uint8_t *puVar4;
  int iVar5;
  MCode *__addr_00;
  long *base;
  ulong uVar6;
  ulong uVar7;
  long *unaff_R13;
  ulong __len;
  bool bVar8;
  bool bVar9;
  
  pMVar1 = J->mcarea;
  uVar7 = (long)J->param[0xd] * 0x400 + 0xfff;
  __len = uVar7 & 0xfffffffffffff000;
  __addr_00 = pMVar1 + -__len;
  if (pMVar1 == (MCode *)0x0) {
    __addr_00 = (MCode *)0x0;
  }
  iVar5 = 0;
  do {
    base = unaff_R13;
    if (__addr_00 != (MCode *)0x0) {
      __addr = (long *)mmap64(__addr_00,__len,3,0x22,-1,0);
      bVar2 = true;
      if ((1 < (long)__addr + 1U) &&
         (bVar8 = 0x3fdfffff < (__len - 0x140000) + (long)__addr,
         bVar9 = 0x3fdfffff < 0x140000U - (long)__addr, bVar2 = bVar9 && bVar8, base = __addr,
         bVar9 && bVar8)) {
        munmap(__addr,__len);
        bVar2 = true;
        base = unaff_R13;
      }
      if (!bVar2) {
        J->mcarea = (MCode *)base;
        J->szmcarea = __len;
        J->mcprot = 3;
        J->mctop = (MCode *)((long)base + __len);
        J->mcbot = (MCode *)(base + 2);
        *base = (long)pMVar1;
        base[1] = __len;
        J->szallmcarea = J->szallmcarea + __len;
        puVar4 = lj_err_register_mcode(base,__len,(uint8_t *)(base + 2));
        J->mcbot = puVar4;
        return;
      }
    }
    uVar3 = J->prngstate;
    do {
      uVar3 = uVar3 * 0x41c64e6d + 0x3039;
      uVar6 = (ulong)(uVar3 >> 1 & 0x7fff0000);
    } while (0x7fbfffff < uVar7 + uVar6);
    J->prngstate = uVar3;
    __addr_00 = (MCode *)(uVar6 - 0x3fcc0000);
    iVar5 = iVar5 + 1;
    unaff_R13 = base;
  } while (iVar5 != 0x1f);
  lj_trace_err(J,LJ_TRERR_MCODEAL);
}

Assistant:

static void mcode_allocarea(jit_State *J)
{
  MCode *oldarea = J->mcarea;
  size_t sz = (size_t)J->param[JIT_P_sizemcode] << 10;
  sz = (sz + LJ_PAGESIZE-1) & ~(size_t)(LJ_PAGESIZE - 1);
  J->mcarea = (MCode *)mcode_alloc(J, sz);
  J->szmcarea = sz;
  J->mcprot = MCPROT_GEN;
  J->mctop = (MCode *)((char *)J->mcarea + J->szmcarea);
  J->mcbot = (MCode *)((char *)J->mcarea + sizeof(MCLink));
  ((MCLink *)J->mcarea)->next = oldarea;
  ((MCLink *)J->mcarea)->size = sz;
  J->szallmcarea += sz;
  J->mcbot = (MCode *)lj_err_register_mcode(J->mcarea, sz, (uint8_t *)J->mcbot);
}